

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3_set_auxdata(sqlite3_context *pCtx,int iArg,void *pAux,_func_void_void_ptr *xDelete)

{
  code *in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  long in_RDI;
  Vdbe *pVdbe;
  AuxData *pAuxData;
  u64 in_stack_ffffffffffffffc8;
  sqlite3 *db;
  _func_void_void_ptr *local_28;
  
  db = *(sqlite3 **)(in_RDI + 0x18);
  local_28 = db->xRollbackCallback;
  while ((local_28 != (_func_void_void_ptr *)0x0 &&
         ((*(int *)(local_28 + 4) != in_ESI ||
          ((*(int *)local_28 != *(int *)(in_RDI + 0x20) && (-1 < in_ESI))))))) {
    local_28 = *(_func_void_void_ptr **)(local_28 + 0x18);
  }
  if (local_28 == (_func_void_void_ptr *)0x0) {
    local_28 = (_func_void_void_ptr *)sqlite3DbMallocZero(db,in_stack_ffffffffffffffc8);
    if (local_28 == (_func_void_void_ptr *)0x0) {
      if (in_RCX == (code *)0x0) {
        return;
      }
      (*in_RCX)(in_RDX);
      return;
    }
    *(int *)local_28 = *(int *)(in_RDI + 0x20);
    *(int *)(local_28 + 4) = in_ESI;
    *(_func_void_void_ptr **)(local_28 + 0x18) = db->xRollbackCallback;
    db->xRollbackCallback = local_28;
    if (*(int *)(in_RDI + 0x24) == 0) {
      *(undefined4 *)(in_RDI + 0x24) = 0xffffffff;
    }
  }
  else if (*(long *)(local_28 + 0x10) != 0) {
    (**(code **)(local_28 + 0x10))(*(undefined8 *)(local_28 + 8));
  }
  *(undefined8 *)(local_28 + 8) = in_RDX;
  *(code **)(local_28 + 0x10) = in_RCX;
  return;
}

Assistant:

SQLITE_API void sqlite3_set_auxdata(
  sqlite3_context *pCtx,
  int iArg,
  void *pAux,
  void (*xDelete)(void*)
){
  AuxData *pAuxData;
  Vdbe *pVdbe;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( pCtx==0 ) return;
#endif
  pVdbe= pCtx->pVdbe;
  assert( sqlite3_mutex_held(pCtx->pOut->db->mutex) );
#ifdef SQLITE_ENABLE_STAT4
  if( pVdbe==0 ) goto failed;
#else
  assert( pVdbe!=0 );
#endif

  for(pAuxData=pVdbe->pAuxData; pAuxData; pAuxData=pAuxData->pNextAux){
    if( pAuxData->iAuxArg==iArg && (pAuxData->iAuxOp==pCtx->iOp || iArg<0) ){
      break;
    }
  }
  if( pAuxData==0 ){
    pAuxData = sqlite3DbMallocZero(pVdbe->db, sizeof(AuxData));
    if( !pAuxData ) goto failed;
    pAuxData->iAuxOp = pCtx->iOp;
    pAuxData->iAuxArg = iArg;
    pAuxData->pNextAux = pVdbe->pAuxData;
    pVdbe->pAuxData = pAuxData;
    if( pCtx->isError==0 ) pCtx->isError = -1;
  }else if( pAuxData->xDeleteAux ){
    pAuxData->xDeleteAux(pAuxData->pAux);
  }

  pAuxData->pAux = pAux;
  pAuxData->xDeleteAux = xDelete;
  return;

failed:
  if( xDelete ){
    xDelete(pAux);
  }
}